

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void stack_init(lua_State *L1,lua_State *L)

{
  StkId pSVar1;
  long lVar2;
  
  pSVar1 = (StkId)luaM_malloc_(L,0x2d0,0);
  (L1->stack).p = pSVar1;
  (L1->tbclist).p = pSVar1;
  lVar2 = 8;
  do {
    *(undefined1 *)((long)(L1->stack).p + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x2d8);
  lVar2 = (L1->stack).offset;
  (L1->stack_last).p = (StkId)(lVar2 + 0x280);
  L1->ci = &L1->base_ci;
  (L1->base_ci).func.offset = lVar2;
  *(undefined1 *)(lVar2 + 8) = 0;
  (L1->base_ci).top.p = (StkId)((L1->base_ci).func.offset + 0x150);
  (L1->base_ci).u.l.savedpc = (Instruction *)0x0;
  (L1->base_ci).callstatus = 0x8000;
  L1->status = '\0';
  L1->errfunc = 0;
  (L1->top).p = (StkId)((L1->stack).offset + 0x10);
  return;
}

Assistant:

static void stack_init (lua_State *L1, lua_State *L) {
  int i;
  /* initialize stack array */
  L1->stack.p = luaM_newvector(L, BASIC_STACK_SIZE + EXTRA_STACK, StackValue);
  L1->tbclist.p = L1->stack.p;
  for (i = 0; i < BASIC_STACK_SIZE + EXTRA_STACK; i++)
    setnilvalue(s2v(L1->stack.p + i));  /* erase new stack */
  L1->stack_last.p = L1->stack.p + BASIC_STACK_SIZE;
  /* initialize first ci */
  resetCI(L1);
  L1->top.p = L1->stack.p + 1;  /* +1 for 'function' entry */
}